

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_method.h
# Opt level: O2

duk_ret_t dukglue::detail::MethodInfo<false,_A,_int>::MethodRuntime::finalize_method
                    (duk_context *ctx)

{
  void *pvVar1;
  
  duk_get_prop_string(ctx,0,anon_var_dwarf_df54);
  pvVar1 = duk_require_pointer(ctx,-1);
  operator_delete(pvVar1,0x10);
  return 0;
}

Assistant:

static duk_ret_t finalize_method(duk_context* ctx)
				{
					// clean up the MethodHolder reference
					duk_get_prop_string(ctx, 0, "\xFF" "method_holder");

					void* method_holder_void = duk_require_pointer(ctx, -1);
					MethodHolder* method_holder = static_cast<MethodHolder*>(method_holder_void);
					delete method_holder;

					return 0;
				}